

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

int lj_tab_next(lua_State *L,GCtab *t,TValue *key)

{
  double *pdVar1;
  double *in_RDX;
  cTValue *in_RSI;
  GCtab *in_RDI;
  Node *n;
  uint32_t i;
  uint local_c4;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  
  local_c4 = keyindex((lua_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_RDI,in_RSI);
  do {
    local_c4 = local_c4 + 1;
    if (in_RSI[3].u32.lo <= local_c4) {
      local_c4 = local_c4 - in_RSI[3].u32.lo;
      while( true ) {
        if (*(uint *)((long)in_RSI + 0x1c) < local_c4) {
          return 0;
        }
        pdVar1 = (double *)((ulong)*(uint *)((long)in_RSI + 0x14) + (ulong)local_c4 * 0x18);
        if (*(int *)((long)pdVar1 + 4) != -1) break;
        local_c4 = local_c4 + 1;
      }
      *in_RDX = pdVar1[1];
      in_RDX[1] = *pdVar1;
      return 1;
    }
  } while (*(int *)((ulong)in_RSI[1].u32.lo + 4 + (ulong)local_c4 * 8) == -1);
  *in_RDX = (double)(int)local_c4;
  in_RDX[1] = *(double *)((ulong)in_RSI[1].u32.lo + (ulong)local_c4 * 8);
  return 1;
}

Assistant:

int lj_tab_next(lua_State *L, GCtab *t, TValue *key)
{
  uint32_t i = keyindex(L, t, key);  /* Find predecessor key index. */
  for (i++; i < t->asize; i++)  /* First traverse the array keys. */
    if (!tvisnil(arrayslot(t, i))) {
      setintV(key, i);
      copyTV(L, key+1, arrayslot(t, i));
      return 1;
    }
  for (i -= t->asize; i <= t->hmask; i++) {  /* Then traverse the hash keys. */
    Node *n = &noderef(t->node)[i];
    if (!tvisnil(&n->val)) {
      copyTV(L, key, &n->key);
      copyTV(L, key+1, &n->val);
      return 1;
    }
  }
  return 0;  /* End of traversal. */
}